

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O0

bool __thiscall
glslang::TIntermediate::isSpecializationOperation(TIntermediate *this,TIntermOperator *node)

{
  bool bVar1;
  int iVar2;
  TOperator TVar3;
  TBasicType TVar4;
  TBasicType type;
  undefined4 extraout_var;
  ulong uVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long *plVar6;
  long *plVar7;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  TBasicType dstType;
  TBasicType srcType;
  TIntermBinary *bin;
  TIntermOperator *node_local;
  TIntermediate *this_local;
  
  iVar2 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
  uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x130))();
  if ((uVar5 & 1) != 0) {
    TVar3 = TIntermOperator::getOp(node);
    bVar1 = IsOpNumericConv(TVar3);
    if (bVar1) {
      iVar2 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
      TVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x38))();
      bVar1 = isTypeFloat(TVar4);
      if (bVar1) {
        iVar2 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x13])();
        plVar7 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 400))();
        plVar7 = (long *)(**(code **)(*plVar7 + 0x78))();
        plVar7 = (long *)(**(code **)(*plVar7 + 0xf0))();
        TVar4 = (**(code **)(*plVar7 + 0x38))();
        bVar1 = isTypeFloat(TVar4);
        if (bVar1) {
          return true;
        }
      }
    }
    TVar3 = TIntermOperator::getOp(node);
    if (TVar3 - EOpIndexDirect < 4) {
      return true;
    }
    return false;
  }
  iVar2 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x14])();
  plVar7 = (long *)CONCAT44(extraout_var_02,iVar2);
  if (plVar7 == (long *)0x0) {
LAB_00738cf4:
    TVar3 = TIntermOperator::getOp(node);
    bVar1 = IsOpNumericConv(TVar3);
    if (bVar1) {
      iVar2 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x13])();
      plVar7 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_03,iVar2) + 400))();
      plVar7 = (long *)(**(code **)(*plVar7 + 0x78))();
      plVar7 = (long *)(**(code **)(*plVar7 + 0xf0))();
      TVar4 = (**(code **)(*plVar7 + 0x38))();
      iVar2 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
      type = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar2) + 0x38))();
      bVar1 = isTypeInt(TVar4);
      if (((bVar1) || (TVar4 == EbtBool)) && ((bVar1 = isTypeInt(type), bVar1 || (type == EbtBool)))
         ) {
        return true;
      }
    }
    TVar3 = TIntermOperator::getOp(node);
    if (((((TVar3 - EOpNegative < 2) || (TVar3 == EOpBitwiseNot)) || (TVar3 - EOpAdd < 0xc)) ||
        ((TVar3 - EOpLessThan < 4 || (TVar3 == EOpVectorTimesScalar)))) ||
       (TVar3 - EOpLogicalOr < 7)) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    plVar6 = (long *)(**(code **)(*plVar7 + 400))();
    plVar6 = (long *)(**(code **)(*plVar6 + 0xf0))();
    uVar5 = (**(code **)(*plVar6 + 0x130))();
    if ((uVar5 & 1) == 0) {
      plVar7 = (long *)(**(code **)(*plVar7 + 0x198))();
      plVar7 = (long *)(**(code **)(*plVar7 + 0xf0))();
      uVar5 = (**(code **)(*plVar7 + 0x130))();
      if ((uVar5 & 1) == 0) goto LAB_00738cf4;
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool TIntermediate::isSpecializationOperation(const TIntermOperator& node) const
{
    // The operations resulting in floating point are quite limited
    // (However, some floating-point operations result in bool, like ">",
    // so are handled later.)
    if (node.getType().isFloatingDomain()) {
        if (IsOpNumericConv(node.getOp()) &&
            isTypeFloat(node.getType().getBasicType()) &&
            isTypeFloat(node.getAsUnaryNode()->getOperand()->getAsTyped()->getType().getBasicType())) {
            return true;
        }
        switch (node.getOp()) {
        case EOpIndexDirect:
        case EOpIndexIndirect:
        case EOpIndexDirectStruct:
        case EOpVectorSwizzle:
            return true;
        default:
            return false;
        }
    }

    // Check for floating-point arguments
    if (const TIntermBinary* bin = node.getAsBinaryNode())
        if (bin->getLeft() ->getType().isFloatingDomain() ||
            bin->getRight()->getType().isFloatingDomain())
            return false;

    // So, for now, we can assume everything left is non-floating-point...

    if (IsOpNumericConv(node.getOp())) {
        TBasicType srcType = node.getAsUnaryNode()->getOperand()->getAsTyped()->getType().getBasicType();
        TBasicType dstType = node.getType().getBasicType();
        if ((isTypeInt(srcType) || srcType == EbtBool) &&
            (isTypeInt(dstType) || dstType == EbtBool)) {
            return true;
        }
    }

    // Now check for integer/bool-based operations
    switch (node.getOp()) {

    // dereference/swizzle
    case EOpIndexDirect:
    case EOpIndexIndirect:
    case EOpIndexDirectStruct:
    case EOpVectorSwizzle:

    // unary operations
    case EOpNegative:
    case EOpLogicalNot:
    case EOpBitwiseNot:

    // binary operations
    case EOpAdd:
    case EOpSub:
    case EOpMul:
    case EOpVectorTimesScalar:
    case EOpDiv:
    case EOpMod:
    case EOpRightShift:
    case EOpLeftShift:
    case EOpAnd:
    case EOpInclusiveOr:
    case EOpExclusiveOr:
    case EOpLogicalOr:
    case EOpLogicalXor:
    case EOpLogicalAnd:
    case EOpEqual:
    case EOpNotEqual:
    case EOpLessThan:
    case EOpGreaterThan:
    case EOpLessThanEqual:
    case EOpGreaterThanEqual:
        return true;
    default:
        return false;
    }
}